

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

void run_timer_loop_once(void)

{
  int iVar1;
  uint uVar2;
  uint child_pid;
  __pid_t child_pid_00;
  undefined1 *puVar3;
  ssize_t sVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  uint extraout_EDX;
  uint uVar7;
  undefined1 *puVar8;
  uv_timer_t timer_handle;
  undefined1 uStack_259;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined1 auStack_248 [160];
  code *pcStack_1a8;
  undefined1 *puStack_198;
  code *pcStack_190;
  int iStack_180;
  uint uStack_17c;
  undefined1 auStack_178 [160];
  code *pcStack_d8;
  uint uStack_c4;
  undefined1 *puStack_c0;
  undefined1 local_a0 [152];
  
  puVar3 = (undefined1 *)uv_default_loop();
  timer_cb_called = 0;
  puVar8 = puVar3;
  iVar1 = uv_timer_init(puVar3,local_a0);
  if (iVar1 == 0) {
    puVar8 = local_a0;
    iVar1 = uv_timer_start(puVar8,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00157817;
    puVar8 = puVar3;
    iVar1 = uv_run(puVar3,0);
    if (iVar1 != 0) goto LAB_0015781c;
    if (timer_cb_called == 1) {
      return;
    }
  }
  else {
    run_timer_loop_once_cold_1();
LAB_00157817:
    run_timer_loop_once_cold_2();
LAB_0015781c:
    run_timer_loop_once_cold_3();
  }
  run_timer_loop_once_cold_4();
  puVar5 = (undefined1 *)((ulong)puVar8 & 0xffffffff);
  pcStack_d8 = (code *)0x15783f;
  puStack_c0 = puVar3;
  uVar2 = waitpid((uint)puVar8,(int *)&uStack_c4,0);
  pcStack_d8 = (code *)0x157854;
  printf("Waited pid is %d with status %d\n",(ulong)uVar2,(ulong)uStack_c4);
  if (uVar2 == 0xffffffff) {
    pcStack_d8 = (code *)0x157881;
    perror("Failed to wait");
  }
  if (uVar2 == (uint)puVar8) {
    if ((uStack_c4 & 0x7f) != 0) goto LAB_00157888;
    if ((uStack_c4 & 0xff00) == 0) {
      return;
    }
  }
  else {
    pcStack_d8 = (code *)0x157888;
    assert_wait_child_cold_1();
LAB_00157888:
    pcStack_d8 = (code *)0x15788d;
    assert_wait_child_cold_2();
  }
  pcStack_d8 = run_test_fork_socketpair;
  assert_wait_child_cold_3();
  pcStack_190 = (code *)0x15789f;
  pcStack_d8 = (code *)puVar5;
  run_timer_loop_once();
  puVar8 = (undefined1 *)0x1;
  uVar7 = 1;
  pcStack_190 = (code *)0x1578b5;
  iVar1 = socketpair(1,1,0,&iStack_180);
  if (iVar1 == 0) {
    pcStack_190 = (code *)0x1578c2;
    puVar8 = (undefined1 *)uv_default_loop();
    puVar3 = auStack_178;
    pcStack_190 = (code *)0x1578d3;
    iVar1 = uv_poll_init(puVar8,puVar3,iStack_180);
    uVar7 = (uint)puVar3;
    if (iVar1 != 0) goto LAB_001579ca;
    pcStack_190 = (code *)0x1578e0;
    child_pid = fork();
    if (child_pid != 0) {
      puVar5 = (undefined1 *)(ulong)child_pid;
      if (child_pid == 0xffffffff) goto LAB_001579d4;
      puVar8 = (undefined1 *)(ulong)uStack_17c;
      uVar7 = 0x1918d0;
      pcStack_190 = (code *)0x157906;
      sVar4 = send(uStack_17c,"hi\n",3,0);
      if (sVar4 == 3) {
        pcStack_190 = (code *)0x157917;
        assert_wait_child(child_pid);
LAB_00157981:
        pcStack_190 = (code *)0x157986;
        puVar5 = (undefined1 *)uv_default_loop();
        pcStack_190 = (code *)0x15799a;
        uv_walk(puVar5,close_walk_cb,0);
        uVar7 = 0;
        pcStack_190 = (code *)0x1579a4;
        uv_run(puVar5);
        pcStack_190 = (code *)0x1579a9;
        puVar8 = (undefined1 *)uv_default_loop();
        pcStack_190 = (code *)0x1579b1;
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          pcStack_190 = (code *)0x1579ba;
          uv_library_shutdown();
          return;
        }
        goto LAB_001579cf;
      }
      goto LAB_001579d9;
    }
    pcStack_190 = (code *)0x15791e;
    puVar8 = (undefined1 *)uv_default_loop();
    pcStack_190 = (code *)0x157926;
    iVar1 = uv_loop_fork();
    if (iVar1 != 0) goto LAB_001579de;
    if (socket_cb_called != 0) goto LAB_001579e3;
    puVar8 = auStack_178;
    uVar7 = 1;
    pcStack_190 = (code *)0x157951;
    iVar1 = uv_poll_start(puVar8,1,socket_cb);
    if (iVar1 != 0) goto LAB_001579e8;
    pcStack_190 = (code *)0x157965;
    puts("Going to run the loop in the child");
    pcStack_190 = (code *)0x15796a;
    puVar8 = (undefined1 *)uv_default_loop();
    uVar7 = 0;
    pcStack_190 = (code *)0x157974;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_001579ed;
    if (socket_cb_called == 1) goto LAB_00157981;
  }
  else {
    pcStack_190 = (code *)0x1579ca;
    run_test_fork_socketpair_cold_1();
LAB_001579ca:
    pcStack_190 = (code *)0x1579cf;
    run_test_fork_socketpair_cold_2();
LAB_001579cf:
    pcStack_190 = (code *)0x1579d4;
    run_test_fork_socketpair_cold_10();
LAB_001579d4:
    pcStack_190 = (code *)0x1579d9;
    run_test_fork_socketpair_cold_8();
LAB_001579d9:
    pcStack_190 = (code *)0x1579de;
    run_test_fork_socketpair_cold_9();
LAB_001579de:
    pcStack_190 = (code *)0x1579e3;
    run_test_fork_socketpair_cold_3();
LAB_001579e3:
    pcStack_190 = (code *)0x1579e8;
    run_test_fork_socketpair_cold_4();
LAB_001579e8:
    pcStack_190 = (code *)0x1579ed;
    run_test_fork_socketpair_cold_5();
LAB_001579ed:
    pcStack_190 = (code *)0x1579f2;
    run_test_fork_socketpair_cold_6();
  }
  pcStack_190 = socket_cb;
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_198 = puVar5;
  pcStack_190 = (code *)(ulong)uVar2;
  if (uVar7 == 0) {
    pcStack_1a8 = (code *)0x157a19;
    uVar7 = extraout_EDX;
    printf("Socket cb got events %d\n");
    puVar5 = puVar8;
    if ((extraout_EDX & 1) == 0) goto LAB_00157a65;
    if (socket_cb_read_fd == 0) {
LAB_00157a50:
      uv_close(puVar8,0);
      return;
    }
    uVar7 = 0x2f5700;
    pcStack_1a8 = (code *)0x157a40;
    sVar4 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar4 == (ulong)socket_cb_read_size * 3) goto LAB_00157a50;
  }
  else {
    pcStack_1a8 = (code *)0x157a65;
    socket_cb_cold_1();
LAB_00157a65:
    pcStack_1a8 = (code *)0x157a6a;
    socket_cb_cold_3();
  }
  pcStack_1a8 = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  pcStack_1a8 = (code *)puVar5;
  iVar1 = pipe(&iStack_250);
  if (iVar1 == 0) {
    run_timer_loop_once();
    uVar7 = 1;
    iVar1 = socketpair(1,1,0,&iStack_258);
    if (iVar1 != 0) goto LAB_00157cd0;
    uVar6 = uv_default_loop();
    puVar8 = auStack_248;
    iVar1 = uv_poll_init(uVar6,puVar8,iStack_258);
    uVar7 = (uint)puVar8;
    if (iVar1 != 0) goto LAB_00157cd5;
    uVar7 = 1;
    iVar1 = uv_poll_start(auStack_248,1,socket_cb);
    if (iVar1 != 0) goto LAB_00157cda;
    uVar6 = uv_default_loop();
    uVar7 = 2;
    iVar1 = uv_run(uVar6);
    if (iVar1 != 1) goto LAB_00157cdf;
    child_pid_00 = fork();
    if (child_pid_00 != 0) {
      if (child_pid_00 == -1) goto LAB_00157ce9;
      iVar1 = uv_poll_stop(auStack_248);
      if (iVar1 != 0) goto LAB_00157cee;
      uv_close(auStack_248);
      uVar6 = uv_default_loop();
      uVar7 = 0;
      iVar1 = uv_run(uVar6);
      if (iVar1 != 0) goto LAB_00157cf8;
      if (socket_cb_called != 0) goto LAB_00157d02;
      uVar7 = 0x1923f5;
      sVar4 = write(iStack_24c,"1",1);
      if (sVar4 != 1) goto LAB_00157d0c;
      uVar7 = 0x1918d0;
      sVar4 = send(iStack_254,"hi\n",3,0);
      if (sVar4 != 3) goto LAB_00157d16;
      uVar6 = uv_default_loop();
      uVar7 = 0;
      iVar1 = uv_run(uVar6);
      if (iVar1 == 0) {
        if (socket_cb_called != 0) goto LAB_00157d2a;
        assert_wait_child(child_pid_00);
        goto LAB_00157c87;
      }
      goto LAB_00157d20;
    }
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    puVar8 = &uStack_259;
    sVar4 = read(iStack_250,puVar8,1);
    uVar7 = (uint)puVar8;
    if (sVar4 != 1) goto LAB_00157cf3;
    uVar6 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar6);
    if (iVar1 != 0) goto LAB_00157cfd;
    if (socket_cb_called != 0) goto LAB_00157d07;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_258;
    socket_cb_read_size = 1;
    uVar6 = uv_default_loop();
    uVar7 = 0;
    iVar1 = uv_run(uVar6);
    if (iVar1 != 0) goto LAB_00157d11;
    if (socket_cb_called != 1) goto LAB_00157d1b;
    uVar7 = 0x2f5700;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_00157c87:
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uVar7 = 0;
      uv_run(uVar6);
      uVar6 = uv_default_loop();
      iVar1 = uv_loop_close(uVar6);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00157ce4;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_00157cd0:
    run_test_fork_socketpair_started_cold_2();
LAB_00157cd5:
    run_test_fork_socketpair_started_cold_3();
LAB_00157cda:
    run_test_fork_socketpair_started_cold_4();
LAB_00157cdf:
    run_test_fork_socketpair_started_cold_5();
LAB_00157ce4:
    run_test_fork_socketpair_started_cold_20();
LAB_00157ce9:
    run_test_fork_socketpair_started_cold_12();
LAB_00157cee:
    run_test_fork_socketpair_started_cold_13();
LAB_00157cf3:
    run_test_fork_socketpair_started_cold_6();
LAB_00157cf8:
    run_test_fork_socketpair_started_cold_14();
LAB_00157cfd:
    run_test_fork_socketpair_started_cold_7();
LAB_00157d02:
    run_test_fork_socketpair_started_cold_15();
LAB_00157d07:
    run_test_fork_socketpair_started_cold_8();
LAB_00157d0c:
    run_test_fork_socketpair_started_cold_16();
LAB_00157d11:
    run_test_fork_socketpair_started_cold_9();
LAB_00157d16:
    run_test_fork_socketpair_started_cold_17();
LAB_00157d1b:
    run_test_fork_socketpair_started_cold_10();
LAB_00157d20:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_00157d2a:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar7;
  uv_close();
  return;
}

Assistant:

static void run_timer_loop_once(void) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();

  timer_cb_called = 0; /* Reset for the child. */

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
}